

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

void Ndr_ObjReadConstant(Vec_Int_t *vFanins,char *pStr)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = 0;
  if (pStr != (char *)0x0) {
    sVar3 = strlen(pStr);
    uVar2 = (uint)sVar3;
  }
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (pStr[uVar9] == 'b') break;
      uVar9 = uVar9 + 1;
      uVar10 = (ulong)uVar2;
    } while (uVar2 != uVar9);
  }
  if ((pStr == (char *)0x0) || (uVar8 = (uint)uVar10, pStr[uVar10 & 0xffffffff] != 'b')) {
    puts(
        "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4\'b1010\")."
        );
    return;
  }
  uVar5 = (((int)(~uVar8 + uVar2) >> 5) + 1) - (uint)((~uVar8 + uVar2 & 0x1f) == 0);
  if (vFanins->nCap < (int)uVar5) {
    if (vFanins->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar4 = (int *)realloc(vFanins->pArray,(long)(int)uVar5 << 2);
    }
    vFanins->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset(vFanins->pArray,0,(ulong)uVar5 << 2);
  }
  vFanins->nSize = uVar5;
  uVar5 = uVar8 + 1;
  if ((int)uVar5 < (int)uVar2) {
    iVar6 = (uVar2 - uVar8) + -2;
    pcVar7 = pStr + uVar5;
    do {
      cVar1 = *pcVar7;
      if (cVar1 != '0') {
        if (cVar1 == '1') {
          vFanins->pArray[iVar6 >> 5] = vFanins->pArray[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
        }
        else {
          printf("Wrongn symbol (%c) in binary Verilog constant \"%s\".\n",(ulong)(uint)(int)cVar1,
                 pStr);
        }
      }
      iVar6 = iVar6 + -1;
      pcVar7 = pcVar7 + 1;
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < (int)uVar2);
  }
  return;
}

Assistant:

void Ndr_ObjReadConstant( Vec_Int_t * vFanins, char * pStr )
{
    int i, k, Len = pStr ? strlen(pStr) : 0;
    for ( k = 0; k < Len; k++ )
        if ( pStr[k] == 'b' )
            break;
    if ( pStr == NULL || pStr[k] != 'b' )
    {
        printf( "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4'b1010\").\n" );
        return;
    }
    Vec_IntFill( vFanins, Abc_BitWordNum(Len-k-1), 0 );
    for ( i = k+1; i < Len; i++ )
        if ( pStr[i] == '1' )
            Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), Len-i-1 );
        else if ( pStr[i] != '0' )
            printf( "Wrongn symbol (%c) in binary Verilog constant \"%s\".\n", pStr[i], pStr );
}